

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.cpp
# Opt level: O2

SchemaCatalogEntry * __thiscall
duckdb::Catalog::GetSchema(Catalog *this,ClientContext *context,string *schema)

{
  CatalogTransaction transaction;
  SchemaCatalogEntry *pSVar1;
  CatalogTransaction local_40;
  
  CatalogTransaction::CatalogTransaction(&local_40,this,context);
  transaction.context.ptr = local_40.context.ptr;
  transaction.db.ptr = local_40.db.ptr;
  transaction.transaction.ptr = local_40.transaction.ptr;
  transaction.transaction_id = local_40.transaction_id;
  transaction.start_time = local_40.start_time;
  pSVar1 = GetSchema(this,transaction,schema);
  return pSVar1;
}

Assistant:

SchemaCatalogEntry &Catalog::GetSchema(ClientContext &context, const string &schema) {
	return GetSchema(GetCatalogTransaction(context), schema);
}